

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O2

void __thiscall picojson::value::value(value *this,int type,bool param_2)

{
  pointer *ppvVar1;
  array *paVar2;
  
  this->type_ = type;
  switch(type) {
  case 1:
    (this->u_).boolean_ = false;
    return;
  case 2:
    (this->u_).number_ = 0.0;
    return;
  case 3:
    paVar2 = (array *)operator_new(0x20);
    (paVar2->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&(paVar2->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>).
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
    (paVar2->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 *)
     &(paVar2->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = 0;
    break;
  case 4:
    paVar2 = (array *)operator_new(0x18);
    (paVar2->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (paVar2->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (paVar2->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    break;
  case 5:
    paVar2 = (array *)operator_new(0x30);
    ppvVar1 = &(paVar2->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    (paVar2->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    paVar2[1].super__Vector_base<picojson::value,_std::allocator<picojson::value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (paVar2->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (paVar2->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    paVar2[1].super__Vector_base<picojson::value,_std::allocator<picojson::value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppvVar1;
    paVar2[1].super__Vector_base<picojson::value,_std::allocator<picojson::value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)ppvVar1;
    paVar2[1].super__Vector_base<picojson::value,_std::allocator<picojson::value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    break;
  default:
    goto switchD_00183ac1_default;
  }
  (this->u_).array_ = paVar2;
switchD_00183ac1_default:
  return;
}

Assistant:

inline value::value(int type, bool) : type_(type) {
    switch (type) {
#define INIT(p, v) case p##type: u_.p = v; break
      INIT(boolean_, false);
      INIT(number_, 0.0);
#ifdef PICOJSON_USE_INT64
      INIT(int64_, 0);
#endif
      INIT(string_, new std::string());
      INIT(array_, new array());
      INIT(object_, new object());
#undef INIT
    default: break;
    }
  }